

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O1

void leveldb::_Test_NumberToString::_RunIt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint64_t num;
  uint64_t num_00;
  uint64_t num_01;
  uint64_t num_02;
  uint64_t num_03;
  uint64_t num_04;
  uint64_t num_05;
  uint64_t num_06;
  uint64_t num_07;
  uint64_t num_08;
  uint64_t num_09;
  uint64_t num_10;
  uint64_t num_11;
  uint64_t num_12;
  uint64_t num_13;
  uint64_t num_14;
  uint64_t num_15;
  string sStack_1d8;
  Tester TStack_1b8;
  
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x11;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0x0,num);
  test::Tester::IsEq<char[2],std::__cxx11::string>(&TStack_1b8,(char (*) [2])0x10a1bb,&sStack_1d8);
  paVar1 = &sStack_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x12;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0x1,num_00);
  test::Tester::IsEq<char[2],std::__cxx11::string>(&TStack_1b8,(char (*) [2])0x10a7a7,&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x13;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0x9,num_01);
  test::Tester::IsEq<char[2],std::__cxx11::string>(&TStack_1b8,(char (*) [2])0x10a199,&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x15;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xa,num_02);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&TStack_1b8,(char (*) [3])0x10a1e4,&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x16;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xb,num_03);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&TStack_1b8,(char (*) [3])"11",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x17;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0x13,num_04);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&TStack_1b8,(char (*) [3])0x10a2fd,&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x18;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0x63,num_05);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&TStack_1b8,(char (*) [3])0x10a3ba,&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x1a;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0x64,num_06);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&TStack_1b8,(char (*) [4])"100",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x1b;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0x6d,num_07);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&TStack_1b8,(char (*) [4])"109",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x1c;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xbe,num_08);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&TStack_1b8,(char (*) [4])"190",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x1d;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0x7b,num_09);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&TStack_1b8,(char (*) [4])0x10a3dd,&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x1e;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xbc614e,num_10);
  test::Tester::IsEq<char[9],std::__cxx11::string>(&TStack_1b8,(char (*) [9])"12345678",&sStack_1d8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x22;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xfffffffffffffd98,num_11);
  test::Tester::IsEq<char[21],std::__cxx11::string>
            (&TStack_1b8,(char (*) [21])"18446744073709551000",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x23;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xfffffffffffffff0,num_12);
  test::Tester::IsEq<char[21],std::__cxx11::string>
            (&TStack_1b8,(char (*) [21])"18446744073709551600",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x24;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xfffffffffffffffa,num_13);
  test::Tester::IsEq<char[21],std::__cxx11::string>
            (&TStack_1b8,(char (*) [21])"18446744073709551610",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x25;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xfffffffffffffffe,num_14);
  test::Tester::IsEq<char[21],std::__cxx11::string>
            (&TStack_1b8,(char (*) [21])"18446744073709551614",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  TStack_1b8.line_ = 0x26;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  NumberToString_abi_cxx11_(&sStack_1d8,(leveldb *)0xffffffffffffffff,num_15);
  test::Tester::IsEq<char[21],std::__cxx11::string>
            (&TStack_1b8,(char (*) [21])"18446744073709551615",&sStack_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  return;
}

Assistant:

TEST(Logging, NumberToString) {
  ASSERT_EQ("0", NumberToString(0));
  ASSERT_EQ("1", NumberToString(1));
  ASSERT_EQ("9", NumberToString(9));

  ASSERT_EQ("10", NumberToString(10));
  ASSERT_EQ("11", NumberToString(11));
  ASSERT_EQ("19", NumberToString(19));
  ASSERT_EQ("99", NumberToString(99));

  ASSERT_EQ("100", NumberToString(100));
  ASSERT_EQ("109", NumberToString(109));
  ASSERT_EQ("190", NumberToString(190));
  ASSERT_EQ("123", NumberToString(123));
  ASSERT_EQ("12345678", NumberToString(12345678));

  static_assert(std::numeric_limits<uint64_t>::max() == 18446744073709551615U,
                "Test consistency check");
  ASSERT_EQ("18446744073709551000", NumberToString(18446744073709551000U));
  ASSERT_EQ("18446744073709551600", NumberToString(18446744073709551600U));
  ASSERT_EQ("18446744073709551610", NumberToString(18446744073709551610U));
  ASSERT_EQ("18446744073709551614", NumberToString(18446744073709551614U));
  ASSERT_EQ("18446744073709551615", NumberToString(18446744073709551615U));
}